

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O0

void __thiscall mjs::value::value(value *this,reference *r)

{
  reference *r_local;
  value *this_local;
  
  this->type_ = reference;
  reference::reference(&(this->field_1).r_,r);
  return;
}

Assistant:

explicit value(const reference& r) : type_(value_type::reference), r_(r) {}